

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O3

void __thiscall Ptex::v2_2::PtexReader::TiledFace::~TiledFace(TiledFace *this)

{
  pointer plVar1;
  pointer pFVar2;
  
  (this->super_TiledFaceBase).super_FaceData.super_PtexFaceData._vptr_PtexFaceData =
       (_func_int **)&PTR__TiledFace_0303de30;
  plVar1 = (this->_offsets).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (plVar1 != (pointer)0x0) {
    operator_delete(plVar1,(long)(this->_offsets).super__Vector_base<long,_std::allocator<long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)plVar1);
  }
  pFVar2 = (this->_fdh).
           super__Vector_base<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pFVar2 != (pointer)0x0) {
    operator_delete(pFVar2,(long)(this->_fdh).
                                 super__Vector_base<Ptex::v2_2::FaceDataHeader,_std::allocator<Ptex::v2_2::FaceDataHeader>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pFVar2);
  }
  TiledFaceBase::~TiledFaceBase(&this->super_TiledFaceBase);
  return;
}

Assistant:

TiledFace(PtexReader* reader, Res resArg, Res tileresArg, int levelid)
            : TiledFaceBase(reader, resArg, tileresArg),
              _levelid(levelid)
        {
            _fdh.resize(_ntiles),
            _offsets.resize(_ntiles);
        }